

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool PairSearchHelperBool
               (ON_RTreeNode *a_nodeA,ON_RTreeBranch *a_branchB,
               ON_RTreePairSearchCallbackResultBool *a_result)

{
  int iVar1;
  bool bVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar3;
  ON__INT_PTR *pOVar4;
  
  iVar1 = a_nodeA->m_count;
  if (0 < (long)iVar1) {
    paVar3 = &a_nodeA->m_branch[0].field_1;
    do {
      bVar2 = PairSearchOverlapHelper
                        ((ON_RTreeBBox *)(paVar3 + -6),&a_branchB->m_rect,a_result->m_tolerance);
      if (bVar2) {
        if (a_nodeA->m_level < 1) {
          bVar2 = (*a_result->m_resultCallbackBool)
                            (a_result->m_context,(ON__INT_PTR)paVar3->m_child,
                             (ON__INT_PTR)(a_branchB->field_1).m_child);
        }
        else {
          bVar2 = PairSearchHelperBool(paVar3->m_child,a_branchB,a_result);
        }
        if (bVar2 == false) {
          return false;
        }
      }
      pOVar4 = (ON__INT_PTR *)(paVar3 + 1);
      paVar3 = paVar3 + 7;
    } while (pOVar4 < a_nodeA->m_branch + iVar1);
  }
  return true;
}

Assistant:

static bool PairSearchHelperBool( const ON_RTreeNode* a_nodeA, const ON_RTreeBranch* a_branchB, ON_RTreePairSearchCallbackResultBool* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  while(branchA < branchAmax)
  {
    if ( PairSearchOverlapHelper( &branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance ) )
    {
      if ( a_nodeA->m_level > 0 )
      {
        if ( !PairSearchHelperBool(branchA->m_child,a_branchB,a_result) )
          return false;
      }
      else
      {
        if ( !a_result->m_resultCallbackBool(a_result->m_context,branchA->m_id,a_branchB->m_id) )
          return false;
      }
    }
    branchA++;
  }
  return true;
}